

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

MPP_RET vdpp2_start(vdpp2_api_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  vdpp2_reg *__s;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  MPP_RET *pMVar6;
  undefined8 in_stack_fffffffffffffe78;
  undefined4 uVar7;
  RK_S32 work_mode;
  RK_S32 ret_cap;
  zme_reg *zme;
  vdpp2_reg *reg;
  undefined4 local_158;
  RK_U32 req_cnt;
  MppReqV1 mpp_req [12];
  RegOffsetInfo reg_off [2];
  MPP_RET local_1c;
  MPP_RET ret;
  vdpp2_api_ctx *ctx_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if (ctx == (vdpp2_api_ctx *)0x0) {
    _mpp_log_l(2,"vdpp2","found NULL input vdpp2 ctx %p\n","vdpp2_start",0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    uVar1 = (ctx->params).working_mode;
    uVar2 = check_cap(&ctx->params);
    if ((((uVar2 & 1) == 0) && (uVar1 == 2)) || (((uVar2 & 2) == 0 && (uVar1 == 3)))) {
      _mpp_log_l(2,"vdpp2","found incompat work mode %d %s, cap %d\n","vdpp2_start",(ulong)uVar1,
                 working_mode_name[(int)(uVar1 & 3)],CONCAT44(uVar7,uVar2));
      ctx_local._4_4_ = MPP_NOK;
    }
    else {
      __s = &ctx->reg;
      memset(&mpp_req[0xb].data_ptr,0,0x10);
      memset(&local_158,0,0x120);
      memset(__s,0,0x440);
      vdpp2_params_to_reg(&ctx->params,ctx);
      local_158 = 0x200;
      req_cnt = 1;
      mpp_req[0].cmd = 0x110;
      mpp_req[0].flag = 0x2000;
      mpp_req[0].data_ptr._0_4_ = 0x200;
      mpp_req[0].data_ptr._4_4_ = 1;
      mpp_req[1].cmd = 0x110;
      mpp_req[1].flag = 0x2200;
      mpp_req[1]._8_8_ = &(ctx->zme).yrgb_ver_coe;
      mpp_req[1].data_ptr._0_4_ = 0x200;
      mpp_req[1].data_ptr._4_4_ = 1;
      mpp_req[2].cmd = 0x110;
      mpp_req[2].flag = 0x2400;
      mpp_req[2]._8_8_ = &(ctx->zme).cbcr_hor_coe;
      mpp_req[2].data_ptr._0_4_ = 0x200;
      mpp_req[2].data_ptr._4_4_ = 1;
      mpp_req[3].cmd = 0x110;
      mpp_req[3].flag = 0x2600;
      mpp_req[3]._8_8_ = &(ctx->zme).cbcr_ver_coe;
      mpp_req[3].data_ptr._0_4_ = 0x200;
      mpp_req[3].data_ptr._4_4_ = 1;
      mpp_req[4].cmd = 0x48;
      mpp_req[4].flag = 0x2800;
      mpp_req[4]._8_8_ = &(ctx->zme).common;
      mpp_req[4].data_ptr._0_4_ = 0x200;
      mpp_req[4].data_ptr._4_4_ = 1;
      mpp_req[5].cmd = 0x54;
      mpp_req[5].flag = 0x80;
      mpp_req[5]._8_8_ = &ctx->dmsr;
      mpp_req[5].data_ptr._0_4_ = 0x200;
      mpp_req[5].data_ptr._4_4_ = 1;
      mpp_req[6].cmd = 0x14;
      mpp_req[6].flag = 0xe0;
      mpp_req[6]._8_8_ = &(ctx->reg).dci;
      mpp_req[6].data_ptr._0_4_ = 0x200;
      mpp_req[6].data_ptr._4_4_ = 1;
      mpp_req[7].cmd = 0x80;
      mpp_req[7].flag = 0x100;
      mpp_req[7]._8_8_ = &(ctx->reg).es;
      mpp_req[7].data_ptr._0_4_ = 0x200;
      mpp_req[7].data_ptr._4_4_ = 1;
      mpp_req[8].cmd = 0x2b0;
      mpp_req[8].flag = 0x200;
      mpp_req[8]._8_8_ = &(ctx->reg).sharp;
      mpp_req[0xb].data_ptr._0_4_ = 0x19;
      mpp_req[0xb].data_ptr._4_4_ = (ctx->params).src.cbcr_offset;
      mpp_req[8].data_ptr._0_4_ = 0x202;
      mpp_req[8].data_ptr._4_4_ = 0x11;
      mpp_req[9].cmd = 0x10;
      mpp_req[9].flag = 0;
      mpp_req[9]._8_8_ = &mpp_req[0xb].data_ptr;
      mpp_req[9].data_ptr._0_4_ = 0x200;
      mpp_req[9].data_ptr._4_4_ = 1;
      mpp_req[10].cmd = 0x70;
      mpp_req[10].flag = 0;
      mpp_req[10].data_ptr._0_4_ = 0x201;
      mpp_req[10].data_ptr._4_4_ = 3;
      mpp_req[0xb].cmd = 0x70;
      mpp_req[0xb].flag = 0;
      mpp_req[0]._8_8_ = &ctx->zme;
      mpp_req[10]._8_8_ = __s;
      mpp_req[0xb]._8_8_ = __s;
      local_1c = ioctl(ctx->fd,0x40047601,&local_158);
      if (local_1c != MPP_OK) {
        puVar3 = (uint *)__errno_location();
        uVar1 = *puVar3;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        _mpp_log_l(2,"vdpp2","ioctl SET_REG failed ret %d errno %d %s\n","vdpp2_start",
                   (ulong)(uint)local_1c,(ulong)uVar1,pcVar5);
        pMVar6 = __errno_location();
        local_1c = *pMVar6;
      }
      ctx_local._4_4_ = local_1c;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET vdpp2_start(struct vdpp2_api_ctx *ctx)
{
    MPP_RET ret;
    RegOffsetInfo reg_off[2];
    MppReqV1 mpp_req[12];
    RK_U32 req_cnt = 0;
    struct vdpp2_reg *reg = NULL;
    struct zme_reg *zme = NULL;
    RK_S32 ret_cap = VDPP_CAP_UNSUPPORTED;
    RK_S32 work_mode;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp2 ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    work_mode = ctx->params.working_mode;
    ret_cap = check_cap(&ctx->params);
    if ((!(ret_cap & VDPP_CAP_VEP) && (VDPP_WORK_MODE_VEP == work_mode)) ||
        (!(ret_cap & VDPP_CAP_HIST) && (VDPP_WORK_MODE_DCI == work_mode))) {
        mpp_err_f("found incompat work mode %d %s, cap %d\n", work_mode,
                  working_mode_name[work_mode & 3], ret_cap);
        return MPP_NOK;
    }

    reg = &ctx->reg;
    zme = &ctx->zme;

    memset(reg_off, 0, sizeof(reg_off));
    memset(mpp_req, 0, sizeof(mpp_req));
    memset(reg, 0, sizeof(*reg));

    vdpp2_params_to_reg(&ctx->params, ctx);

    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->yrgb_hor_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_YRGB_HOR_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->yrgb_hor_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->yrgb_ver_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_YRGB_VER_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->yrgb_ver_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->cbcr_hor_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_CBCR_HOR_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->cbcr_hor_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->cbcr_ver_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_CBCR_VER_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->cbcr_ver_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->common);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_ZME_COMMON;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->common);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(ctx->dmsr);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_DMSR;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&ctx->dmsr);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->dci);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_DCI;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->dci);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->es);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_ES;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->es);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->sharp);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_SHARP;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->sharp);

    /* set reg offset */
    reg_off[0].reg_idx = 25;
    reg_off[0].offset = ctx->params.src.cbcr_offset;
    reg_off[1].reg_idx = 27;

    if (!ctx->params.yuv_out_diff)
        reg_off[1].offset = ctx->params.dst.cbcr_offset;
    else
        reg_off[1].offset = ctx->params.dst_c.cbcr_offset;
    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_REG_OFFSET_ALONE;
    mpp_req[req_cnt].size = sizeof(reg_off);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(reg_off);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->common);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->common);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_READ;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->common);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->common);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req[0]);

    if (ret) {
        mpp_err_f("ioctl SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    return ret;
}